

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_error_code_e ktxTexture2_CreateCopy(ktxTexture2 *orig,ktxTexture2 **newTex)

{
  ktx_error_code_e kVar1;
  ktxTexture2 *This;
  
  if (newTex == (ktxTexture2 **)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    This = (ktxTexture2 *)malloc(0xa8);
    if (This == (ktxTexture2 *)0x0) {
      kVar1 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar1 = ktxTexture2_constructCopy(This,orig);
      if (kVar1 == KTX_SUCCESS) {
        *newTex = This;
      }
      else {
        free(This);
      }
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
 ktxTexture2_CreateCopy(ktxTexture2* orig, ktxTexture2** newTex)
 {
    KTX_error_code result;

    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture2* tex = (ktxTexture2*)malloc(sizeof(ktxTexture2));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture2_constructCopy(tex, orig);
    if (result != KTX_SUCCESS) {
        free(tex);
    } else {
        *newTex = tex;
    }
    return result;

 }